

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KM_tai.cpp
# Opt level: O3

tai * __thiscall Kumu::TAI::tai::operator=(tai *this,caltime *rhs)

{
  i32_t iVar1;
  
  iVar1 = caldate_mjd(&rhs->date);
  this->x = (long)iVar1 * 0x15180 + (long)rhs->second + 0x3fffffff2efbbf8a +
            (long)((rhs->hour * 0x3c + rhs->minute) - rhs->offset) * 0x3c;
  return this;
}

Assistant:

const Kumu::TAI::tai&
Kumu::TAI::tai::operator=(const Kumu::TAI::caltime& rhs)
{
  caltime_tai(&rhs, this);
  return *this;
}